

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_test.cpp
# Opt level: O1

vector<long_long,_std::allocator<long_long>_> *
populateVector(vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,int n)

{
  iterator __position;
  int iVar1;
  long in_RAX;
  long local_28;
  
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < n) {
    local_28 = in_RAX;
    do {
      iVar1 = rand();
      local_28 = (long)(iVar1 + -0x3fffffff);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                  (__return_storage_ptr__,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      n = n + -1;
    } while (n != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ll> populateVector(int n) {
    vector<ll> v;
    rep(i,0,n) {
        v.push_back(rand() - RAND_MAX/2);
    }
    return v;
}